

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3DropTriggerPtr(Parse *pParse,Trigger *pTrigger)

{
  sqlite3 *db;
  char *zArg3;
  int iDb;
  int iVar1;
  Table *pTVar2;
  Vdbe *p;
  char *zArg1;
  
  db = pParse->db;
  iDb = sqlite3SchemaToIndex(db,pTrigger->pSchema);
  pTVar2 = tableOfTrigger(pTrigger);
  if (pTVar2 != (Table *)0x0) {
    zArg3 = db->aDb[iDb].zDbSName;
    iVar1 = sqlite3AuthCheck(pParse,(iDb != 1) + 0xe + (uint)(iDb != 1),pTrigger->zName,
                             pTVar2->zName,zArg3);
    if (iVar1 != 0) {
      return;
    }
    zArg1 = "sqlite_master";
    if (iDb == 1) {
      zArg1 = "sqlite_temp_master";
    }
    iVar1 = sqlite3AuthCheck(pParse,9,zArg1,(char *)0x0,zArg3);
    if (iVar1 != 0) {
      return;
    }
  }
  p = sqlite3GetVdbe(pParse);
  if (p != (Vdbe *)0x0) {
    sqlite3NestedParse(pParse,"DELETE FROM %Q.sqlite_master WHERE name=%Q AND type=\'trigger\'",
                       db->aDb[iDb].zDbSName);
    sqlite3ChangeCookie(pParse,iDb);
    sqlite3VdbeAddOp4(p,0x9a,iDb,0,0,pTrigger->zName,0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTriggerPtr(Parse *pParse, Trigger *pTrigger){
  Table   *pTable;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  iDb = sqlite3SchemaToIndex(pParse->db, pTrigger->pSchema);
  assert( iDb>=0 && iDb<db->nDb );
  pTable = tableOfTrigger(pTrigger);
  assert( (pTable && pTable->pSchema==pTrigger->pSchema) || iDb==1 );
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( pTable ){
    int code = SQLITE_DROP_TRIGGER;
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zTab = SCHEMA_TABLE(iDb);
    if( iDb==1 ) code = SQLITE_DROP_TEMP_TRIGGER;
    if( sqlite3AuthCheck(pParse, code, pTrigger->zName, pTable->zName, zDb) ||
      sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb) ){
      return;
    }
  }
#endif

  /* Generate code to destroy the database record of the trigger.
  */
  if( (v = sqlite3GetVdbe(pParse))!=0 ){
    sqlite3NestedParse(pParse,
       "DELETE FROM %Q." LEGACY_SCHEMA_TABLE " WHERE name=%Q AND type='trigger'",
       db->aDb[iDb].zDbSName, pTrigger->zName
    );
    sqlite3ChangeCookie(pParse, iDb);
    sqlite3VdbeAddOp4(v, OP_DropTrigger, iDb, 0, 0, pTrigger->zName, 0);
  }
}